

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result_conflict __thiscall
testing::internal::FunctionMocker<unsigned_long_()>::PerformDefaultAction
          (FunctionMocker<unsigned_long_()> *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<unsigned_long_()> *this_00;
  Action<unsigned_long_()> *pAVar2;
  runtime_error *this_01;
  undefined1 local_58 [8];
  string message;
  OnCallSpec<unsigned_long_()> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<unsigned_long_()> *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<unsigned_long_()> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<unsigned_long>::Exists();
    if (!bVar1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)local_58);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = (FunctionMocker<unsigned_long_()> *)DefaultValue<unsigned_long>::Get();
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    pAVar2 = OnCallSpec<unsigned_long_()>::GetAction(this_00);
    this_local = (FunctionMocker<unsigned_long_()> *)Action<unsigned_long_()>::Perform(pAVar2);
  }
  return (Result_conflict)this_local;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }